

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void PeleLM::init_once(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pbVar3;
  long lVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  mapped_type *pmVar10;
  StateDescriptor *this;
  ostream *poVar11;
  Print *pPVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  mapped_type *pmVar14;
  int i_1;
  int i;
  long lVar15;
  long lVar16;
  bool bVar17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_292;
  allocator local_291;
  int dummy_State_Type;
  int tRhoRT;
  int tRhoH;
  int tTemp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  otherKeys;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  specNames;
  key_type local_230;
  string ppStr;
  string local_1f0 [32];
  string local_1d0 [328];
  ParmParse pp;
  
  tTemp = -1;
  std::__cxx11::string::string((string *)&ppStr,"temp",(allocator *)&pp);
  bVar6 = amrex::AmrLevel::isStateVariable(&ppStr,&dummy_State_Type,&tTemp);
  std::__cxx11::string::~string((string *)&ppStr);
  if (tTemp != NavierStokesBase::Temp) {
    amrex::Assert_host("tTemp == Temp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                       ,0x438,(char *)0x0);
  }
  tRhoH = -1;
  if (bVar6 && dummy_State_Type == 0) {
    std::__cxx11::string::string((string *)&ppStr,"rhoh",(allocator *)&pp);
    bVar6 = amrex::AmrLevel::isStateVariable(&ppStr,&dummy_State_Type,&tRhoH);
    std::__cxx11::string::~string((string *)&ppStr);
  }
  else {
    bVar6 = false;
  }
  if (tRhoH != RhoH) {
    amrex::Assert_host("tRhoH == RhoH",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                       ,0x43d,(char *)0x0);
  }
  bVar17 = dummy_State_Type == 0;
  tRhoRT = -1;
  std::__cxx11::string::string((string *)&ppStr,"RhoRT",(allocator *)&pp);
  bVar7 = amrex::AmrLevel::isStateVariable(&ppStr,&dummy_State_Type,&tRhoRT);
  have_rhort = (int)bVar7;
  std::__cxx11::string::~string((string *)&ppStr);
  if (tRhoRT != RhoRT) {
    amrex::Assert_host("tRhoRT == RhoRT",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                       ,0x442,(char *)0x0);
  }
  have_rhort = (int)(dummy_State_Type == 0 && have_rhort != 0);
  if ((bVar6 & bVar17) == 0) {
    amrex::Abort_host("PeleLM::init_once(): RhoH & Temp must both be the state");
  }
  if (NavierStokesBase::Temp < RhoH) {
    amrex::Abort_host("PeleLM::init_once(): must have RhoH < Temp");
  }
  if (NavierStokesBase::advectionType.super_vector<AdvectionForm,_std::allocator<AdvectionForm>_>.
      super__Vector_base<AdvectionForm,_std::allocator<AdvectionForm>_>._M_impl.
      super__Vector_impl_data._M_start[NavierStokesBase::Temp] == Conservative) {
    amrex::Abort_host("PeleLM::init_once(): Temp must be non-conservative");
  }
  if (NavierStokesBase::advectionType.super_vector<AdvectionForm,_std::allocator<AdvectionForm>_>.
      super__Vector_base<AdvectionForm,_std::allocator<AdvectionForm>_>._M_impl.
      super__Vector_impl_data._M_start[RhoH] != Conservative) {
    amrex::Abort_host("PeleLM::init_once(): RhoH must be conservative");
  }
  iVar8 = first_spec + 8;
  last_spec = iVar8;
  for (lVar15 = (long)first_spec; lVar15 <= iVar8; lVar15 = lVar15 + 1) {
    if (NavierStokesBase::advectionType.super_vector<AdvectionForm,_std::allocator<AdvectionForm>_>.
        super__Vector_base<AdvectionForm,_std::allocator<AdvectionForm>_>._M_impl.
        super__Vector_impl_data._M_start[lVar15] != Conservative) {
      amrex::Error_host("PeleLM::init_once: species must be conservative");
      iVar8 = last_spec;
    }
  }
  lVar15 = (long)first_spec;
  iVar9 = NavierStokesBase::is_diffusive.super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [lVar15];
  do {
    lVar16 = lVar15;
    do {
      if (iVar8 <= lVar16) {
        ppStr._M_dataplus._M_p = (pointer)0xbff0000000000000;
        std::vector<double,_std::allocator<double>_>::resize
                  (&typical_values.super_vector<double,_std::allocator<double>_>,
                   (long)NavierStokesBase::NUM_STATE,(value_type_conflict2 *)&ppStr);
        typical_values.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [RhoH] = -10000000000.0;
        specNames.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        specNames.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        specNames.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pele::physics::eos::speciesNames<pele::physics::eos::Fuego>(&specNames);
        std::__cxx11::string::string((string *)&ppStr,"ht",(allocator *)&local_280);
        amrex::ParmParse::ParmParse(&pp,&ppStr);
        std::__cxx11::string::~string((string *)&ppStr);
        for (lVar15 = 0; lVar15 != 0x120; lVar15 = lVar15 + 0x20) {
          std::__cxx11::string::string((string *)&local_280,"typValY_",(allocator *)&local_230);
          std::operator+(&ppStr,&local_280,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((specNames.
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar15));
          std::__cxx11::string::~string((string *)&local_280);
          iVar8 = amrex::ParmParse::countval(&pp,ppStr._M_dataplus._M_p,-1);
          _Var5 = ppStr._M_dataplus;
          if (0 < iVar8) {
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                      ::operator[](&typical_values_FileVals_abi_cxx11_,
                                   (key_type *)
                                   ((long)&((specNames.
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + lVar15));
            amrex::ParmParse::get(&pp,_Var5._M_p,pmVar10,0);
          }
          std::__cxx11::string::~string((string *)&ppStr);
        }
        std::__cxx11::string::string((string *)&ppStr,"Temp",(allocator *)&local_280);
        std::__cxx11::string::string(local_1f0,"RhoH",(allocator *)&local_230);
        std::__cxx11::string::string(local_1d0,"Vel",&local_291);
        __l._M_len = 3;
        __l._M_array = &ppStr;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&otherKeys.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ,__l,&local_292);
        lVar15 = 0x40;
        do {
          std::__cxx11::string::~string(local_1f0 + lVar15 + -0x20);
          lVar15 = lVar15 + -0x20;
        } while (lVar15 != -0x20);
        lVar16 = 0;
        for (lVar15 = 0; iVar8 = RhoYdot_Type,
            lVar15 < (long)otherKeys.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)otherKeys.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5; lVar15 = lVar15 + 1) {
          std::__cxx11::string::string((string *)&local_280,"typVal_",(allocator *)&local_230);
          std::operator+(&ppStr,&local_280,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&((otherKeys.
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar16));
          std::__cxx11::string::~string((string *)&local_280);
          iVar8 = amrex::ParmParse::countval(&pp,ppStr._M_dataplus._M_p,-1);
          _Var5 = ppStr._M_dataplus;
          if (0 < iVar8) {
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                      ::operator[](&typical_values_FileVals_abi_cxx11_,
                                   (key_type *)
                                   ((long)&((otherKeys.
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + lVar16));
            amrex::ParmParse::get(&pp,_Var5._M_p,pmVar10,0);
          }
          std::__cxx11::string::~string((string *)&ppStr);
          lVar16 = lVar16 + 0x20;
        }
        if (-1 < RhoYdot_Type) {
          iVar9 = amrex::DescriptorList::size((DescriptorList *)amrex::AmrLevel::desc_lst);
          if (iVar8 < iVar9) {
            bVar6 = RhoYdot_Type != 0 && RhoYdot_Type != NavierStokesBase::Divu_Type;
            goto LAB_0018105b;
          }
        }
        bVar6 = false;
LAB_0018105b:
        amrex::ParmParse::query
                  (&pp,"chem_box_chop_threshold",&(anonymous_namespace)::chem_box_chop_threshold,0);
        if ((anonymous_namespace)::chem_box_chop_threshold < 1) {
          (anonymous_namespace)::chem_box_chop_threshold = 4;
        }
        if (!bVar6) {
          amrex::Error_host("PeleLM::init_once(): need RhoYdot_Type if do_chemistry");
        }
        this = amrex::DescriptorList::operator[]
                         ((DescriptorList *)amrex::AmrLevel::desc_lst,RhoYdot_Type);
        iVar8 = amrex::StateDescriptor::nComp(this);
        if (iVar8 < 9) {
          amrex::Error_host("PeleLM::init_once(): RhoYdot_Type needs NUM_SPECIES components");
        }
        if (unity_Le != 0) {
          if ((schmidt != prandtl) || (NAN(schmidt) || NAN(prandtl))) {
            if (NavierStokesBase::verbose != 0) {
              poVar11 = amrex::OutStream();
              amrex::Print::Print((Print *)&ppStr,poVar11);
              paVar1 = &ppStr.field_2;
              std::operator<<((ostream *)paVar1->_M_local_buf,
                              "**************** WARNING ***************\n");
              std::operator<<((ostream *)paVar1->_M_local_buf,
                              "PeleLM::init_once() : currently must have");
              std::operator<<((ostream *)paVar1->_M_local_buf,
                              "equal Schmidt and Prandtl numbers unless !unity_Le.\n");
              std::operator<<((ostream *)paVar1->_M_local_buf,"Setting Schmidt = Prandtl\n");
              std::operator<<((ostream *)paVar1->_M_local_buf,
                              "**************** WARNING ***************\n");
              amrex::Print::~Print((Print *)&ppStr);
            }
            schmidt = prandtl;
          }
        }
        NavierStokesBase::num_state_type =
             amrex::DescriptorList::size((DescriptorList *)amrex::AmrLevel::desc_lst);
        if (NavierStokesBase::verbose != 0) {
          poVar11 = amrex::OutStream();
          amrex::Print::Print((Print *)&ppStr,poVar11);
          std::operator<<((ostream *)ppStr.field_2._M_local_buf,
                          "PeleLM::init_once(): num_state_type = ");
          pPVar12 = amrex::Print::operator<<((Print *)&ppStr,&NavierStokesBase::num_state_type);
          std::operator<<((ostream *)&pPVar12->ss,'\n');
          amrex::Print::~Print((Print *)&ppStr);
        }
        amrex::ParmParse::query(&pp,"plot_reactions",&plot_reactions,0);
        if (plot_reactions == true) {
          std::__cxx11::string::string((string *)&ppStr,"REACTIONS",(allocator *)&local_280);
          pvVar13 = &std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[](&auxDiag_names_abi_cxx11_,&ppStr)->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(pvVar13,0x15);
          std::__cxx11::string::~string((string *)&ppStr);
          poVar11 = amrex::OutStream();
          amrex::Print::Print((Print *)&ppStr,poVar11);
          paVar1 = &ppStr.field_2;
          std::operator<<((ostream *)paVar1->_M_local_buf,"NUM_REACTIONS = ");
          std::ostream::operator<<(paVar1,0x15);
          std::operator<<((ostream *)paVar1->_M_local_buf,'\n');
          amrex::Print::~Print((Print *)&ppStr);
          lVar15 = 0;
          lVar16 = 0;
          while( true ) {
            std::__cxx11::string::string((string *)&ppStr,"REACTIONS",(allocator *)&local_280);
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](&auxDiag_names_abi_cxx11_,(key_type *)&ppStr);
            pbVar2 = (pmVar14->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar3 = (pmVar14->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::~string((string *)&ppStr);
            if ((long)pbVar2 - (long)pbVar3 >> 5 <= lVar16) break;
            std::__cxx11::string::string((string *)&local_280,"R",&local_291);
            amrex::Concatenate(&ppStr,&local_280,(int)lVar16 + 1,5);
            std::__cxx11::string::string((string *)&local_230,"REACTIONS",(allocator *)&local_292);
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](&auxDiag_names_abi_cxx11_,&local_230);
            std::__cxx11::string::operator=
                      ((string *)
                       ((long)&(((pmVar14->
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar15),(string *)&ppStr);
            std::__cxx11::string::~string((string *)&local_230);
            std::__cxx11::string::~string((string *)&ppStr);
            std::__cxx11::string::~string((string *)&local_280);
            lVar15 = lVar15 + 0x20;
            lVar16 = lVar16 + 1;
          }
          poVar11 = amrex::OutStream();
          amrex::Print::Print((Print *)&ppStr,poVar11);
          std::operator<<((ostream *)ppStr.field_2._M_local_buf,
                          "***** Make sure to increase amr.regrid_int !!!!!");
          std::operator<<((ostream *)ppStr.field_2._M_local_buf,'\n');
          amrex::Print::~Print((Print *)&ppStr);
        }
        amrex::ParmParse::query(&pp,"plot_consumption",&plot_consumption,0);
        amrex::ParmParse::query(&pp,"plot_auxDiags",&plot_consumption,0);
        if (plot_consumption == true) {
          if (consumptionName_abi_cxx11_.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              consumptionName_abi_cxx11_.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start &&
              -1 < (long)consumptionName_abi_cxx11_.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)consumptionName_abi_cxx11_.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) {
            std::__cxx11::string::string((string *)&ppStr,"CONSUMPTION",(allocator *)&local_280);
            pvVar13 = &std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       ::operator[](&auxDiag_names_abi_cxx11_,&ppStr)->
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::resize(pvVar13,(long)consumptionName_abi_cxx11_.
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)consumptionName_abi_cxx11_.
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
            std::__cxx11::string::~string((string *)&ppStr);
            lVar16 = 0;
            for (lVar15 = 0;
                lVar15 < (long)consumptionName_abi_cxx11_.
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)consumptionName_abi_cxx11_.
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5; lVar15 = lVar15 + 1)
            {
              std::operator+(&ppStr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&((consumptionName_abi_cxx11_.
                                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar16),"_ConsumptionRate");
              std::__cxx11::string::string
                        ((string *)&local_280,"CONSUMPTION",(allocator *)&local_230);
              pmVar14 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        ::operator[](&auxDiag_names_abi_cxx11_,&local_280);
              std::__cxx11::string::operator=
                        ((string *)
                         ((long)&(((pmVar14->
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar16),(string *)&ppStr);
              std::__cxx11::string::~string((string *)&local_280);
              std::__cxx11::string::~string((string *)&ppStr);
              lVar16 = lVar16 + 0x20;
            }
          }
        }
        amrex::ParmParse::query(&pp,"plot_heat_release",&plot_heat_release,0);
        if (plot_heat_release == true) {
          std::__cxx11::string::string((string *)&ppStr,"HEATRELEASE",(allocator *)&local_280);
          pvVar13 = &std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[](&auxDiag_names_abi_cxx11_,&ppStr)->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(pvVar13,1);
          std::__cxx11::string::~string((string *)&ppStr);
          std::__cxx11::string::string((string *)&ppStr,"HEATRELEASE",(allocator *)&local_280);
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ::operator[](&auxDiag_names_abi_cxx11_,&ppStr);
          std::__cxx11::string::assign
                    ((char *)(pmVar14->
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
          std::__cxx11::string::~string((string *)&ppStr);
        }
        init_once_done = 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&otherKeys.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&pp);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&specNames.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
        return;
      }
      lVar15 = lVar16 + 1;
      lVar4 = lVar16 + 1;
      lVar16 = lVar15;
    } while (NavierStokesBase::is_diffusive.super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             [lVar4] == iVar9);
    amrex::Error_host("PeleLM::init_once: Le != 1; diffuse");
    iVar8 = last_spec;
  } while( true );
}

Assistant:

void
PeleLM::init_once ()
{
   //
   // Computes the static variables unique to PeleLM.
   // Check that (some) things are set up correctly.
   //
   int dummy_State_Type;

   int tTemp = -1;
   int have_temp = isStateVariable("temp", dummy_State_Type, tTemp);
   AMREX_ALWAYS_ASSERT(tTemp == Temp);

   have_temp = have_temp && State_Type == dummy_State_Type;
   int tRhoH = -1;
   have_temp = have_temp && isStateVariable("rhoh", dummy_State_Type, tRhoH);
   AMREX_ALWAYS_ASSERT(tRhoH == RhoH);
   have_temp = have_temp && State_Type == dummy_State_Type;

   int tRhoRT = -1;
   have_rhort = isStateVariable("RhoRT", dummy_State_Type, tRhoRT);
   AMREX_ALWAYS_ASSERT(tRhoRT == RhoRT);
   have_rhort = have_rhort && State_Type == dummy_State_Type;

   if (!have_temp)
     amrex::Abort("PeleLM::init_once(): RhoH & Temp must both be the state");

   if (Temp < RhoH)
     amrex::Abort("PeleLM::init_once(): must have RhoH < Temp");
   //
   // Temperature must be non-conservative, rho*h must be conservative.
   //
   if (advectionType[Temp] == Conservative)
     amrex::Abort("PeleLM::init_once(): Temp must be non-conservative");

   if (advectionType[RhoH] != Conservative)
     amrex::Abort("PeleLM::init_once(): RhoH must be conservative");
   //
   // Species checks.
   //
   AMREX_ASSERT(Temp > RhoH && RhoH > Density);
   //
   // Here we want to count relative to Density instead of relative
   // to RhoH, so we can put RhoH after the species instead of before.
   // This logic should work in both cases.
   last_spec  = first_spec + NUM_SPECIES - 1;

   for (int i = first_spec; i <= last_spec; i++)
      if (advectionType[i] != Conservative)
         amrex::Error("PeleLM::init_once: species must be conservative");

   int diffuse_spec = is_diffusive[first_spec];
   for (int i = first_spec+1; i <= last_spec; i++) {
      if (is_diffusive[i] != diffuse_spec) {
         amrex::Error("PeleLM::init_once: Le != 1; diffuse");
      }
   }

   //
   // make space for typical values
   //
   typical_values.resize(NUM_STATE,-1); // -ve means don't use for anything
   typical_values[RhoH] = typical_RhoH_value_default;

   Vector<std::string> specNames;
   pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(specNames);
   ParmParse pp("ht");
   for (int i=0; i<NUM_SPECIES; ++i) {
     const std::string ppStr = std::string("typValY_") + specNames[i];
     if (pp.countval(ppStr.c_str())>0) {
       pp.get(ppStr.c_str(),typical_values_FileVals[specNames[i]]);
     }
   }
   Vector<std::string> otherKeys = {"Temp", "RhoH", "Vel"};
   for (int i=0; i<otherKeys.size(); ++i) {
     const std::string ppStr(std::string("typVal_")+otherKeys[i]);
     if (pp.countval(ppStr.c_str())>0) {
       pp.get(ppStr.c_str(),typical_values_FileVals[otherKeys[i]]);
     }
   }

   //
   // Chemistry.
   //
   int ydot_good = RhoYdot_Type >= 0 && RhoYdot_Type <  desc_lst.size()
                                     && RhoYdot_Type != Divu_Type
                                     && RhoYdot_Type != State_Type;


   //
   // This is the minimum number of boxes per MPI proc that I want
   // when chopping up chemistry work.
   //
   pp.query("chem_box_chop_threshold",chem_box_chop_threshold);

   if (chem_box_chop_threshold <= 0)
   {
#ifdef AMREX_USE_OMP
     chem_box_chop_threshold = 8;
#else
     chem_box_chop_threshold = 4;
#endif
   }

   if (!ydot_good)
      amrex::Error("PeleLM::init_once(): need RhoYdot_Type if do_chemistry");

   if (desc_lst[RhoYdot_Type].nComp() < NUM_SPECIES)
      amrex::Error("PeleLM::init_once(): RhoYdot_Type needs NUM_SPECIES components");
   //
   // Enforce Le = 1, unless !unity_Le
   //
   if (unity_Le && (schmidt != prandtl) )
   {
      if (verbose)
        amrex::Print() << "**************** WARNING ***************\n"
                       << "PeleLM::init_once() : currently must have"
                       << "equal Schmidt and Prandtl numbers unless !unity_Le.\n"
                       << "Setting Schmidt = Prandtl\n"
                       << "**************** WARNING ***************\n";
      schmidt = prandtl;
   }
   //
   // We are done.
   //
   num_state_type = desc_lst.size();

   if (verbose)
      amrex::Print() << "PeleLM::init_once(): num_state_type = " << num_state_type << '\n';

   pp.query("plot_reactions",plot_reactions);
   if (plot_reactions)
   {
      auxDiag_names["REACTIONS"].resize(NUM_REACTIONS);
      amrex::Print() << "NUM_REACTIONS = "<< NUM_REACTIONS << '\n';
      for (int i = 0; i < auxDiag_names["REACTIONS"].size(); ++i)
         auxDiag_names["REACTIONS"][i] = amrex::Concatenate("R",i+1);
      amrex::Print() << "***** Make sure to increase amr.regrid_int !!!!!" << '\n';
   }

   pp.query("plot_consumption",plot_consumption);
   pp.query("plot_auxDiags",plot_consumption); // This is for backward comptibility - FIXME
   if (plot_consumption && consumptionName.size()>0)
   {
      auxDiag_names["CONSUMPTION"].resize(consumptionName.size());
      for (int j=0; j<consumptionName.size(); ++j)
      {
         auxDiag_names["CONSUMPTION"][j] = consumptionName[j] + "_ConsumptionRate";
      }
   }

   pp.query("plot_heat_release",plot_heat_release);
   if (plot_heat_release)
   {
      auxDiag_names["HEATRELEASE"].resize(1);
      auxDiag_names["HEATRELEASE"][0] = "HeatRelease";
   }

   init_once_done = 1;
}